

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

ValueIterator __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert_to_bucket
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val,
          size_t *bucketIdx)

{
  size_t sVar1;
  reference this_00;
  reference this_01;
  iterator iVar2;
  float fVar3;
  float fVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_38;
  const_iterator local_30;
  size_type *local_28;
  size_t *bucketIdx_local;
  ValueT *val_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  local_28 = bucketIdx;
  bucketIdx_local = (size_t *)val;
  val_local = (ValueT *)this;
  fVar3 = load_factor(this);
  fVar4 = max_load_factor(this);
  if (fVar4 < fVar3) {
    sVar1 = bucket_count(this);
    rehash(this,sVar1 << 1);
    sVar1 = hash_to_bucket(this,(int *)bucketIdx_local);
    *local_28 = sVar1;
  }
  this->mSize = this->mSize + 1;
  this_00 = std::
            vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            ::operator[](&this->mBuckets,*local_28);
  this_01 = std::
            vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            ::operator[](&this->mBuckets,*local_28);
  local_38._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_01);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
              *)&local_30,&local_38);
  iVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                    (this_00,local_30,(value_type *)bucketIdx_local);
  return (ValueIterator)iVar2._M_current;
}

Assistant:

ValueIterator insert_to_bucket(const ValueT& val, size_t& bucketIdx) {
      if (load_factor() > max_load_factor()) {
        rehash(2*bucket_count());
        bucketIdx = hash_to_bucket(val.first); // bucket size change after rehash
      }
      ++mSize;
      return mBuckets[bucketIdx].insert(mBuckets[bucketIdx].end(), val);
    }